

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::IPCFrame::Serialize(IPCFrame *this,Message *msg)

{
  bool bVar1;
  IPCFrame_BindService *this_00;
  IPCFrame_BindServiceReply *this_01;
  IPCFrame_InvokeMethod *this_02;
  IPCFrame_InvokeMethodReply *this_03;
  IPCFrame_RequestError *this_04;
  Message *pMVar2;
  reference str;
  void *data;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Message *msg_local;
  IPCFrame *this_local;
  
  bVar1 = std::bitset<8UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,2,this->request_id_);
  }
  bVar1 = std::bitset<8UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    this_00 = protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindService>::operator*
                        (&this->msg_bind_service_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,3);
    IPCFrame_BindService::Serialize(this_00,pMVar2);
  }
  bVar1 = std::bitset<8UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    this_01 = protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindServiceReply>::operator*
                        (&this->msg_bind_service_reply_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,4);
    IPCFrame_BindServiceReply::Serialize(this_01,pMVar2);
  }
  bVar1 = std::bitset<8UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    this_02 = protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod>::operator*
                        (&this->msg_invoke_method_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,5);
    IPCFrame_InvokeMethod::Serialize(this_02,pMVar2);
  }
  bVar1 = std::bitset<8UL>::operator[](&this->_has_field_,6);
  if (bVar1) {
    this_03 = protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethodReply>::operator*
                        (&this->msg_invoke_method_reply_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,6);
    IPCFrame_InvokeMethodReply::Serialize(this_03,pMVar2);
  }
  bVar1 = std::bitset<8UL>::operator[](&this->_has_field_,7);
  if (bVar1) {
    this_04 = protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError>::operator*
                        (&this->msg_request_error_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,7);
    IPCFrame_RequestError::Serialize(this_04,pMVar2);
  }
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->data_for_testing_);
  it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->data_for_testing_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&it), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
    protozero::Message::AppendString(msg,1,str);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void IPCFrame::Serialize(::protozero::Message* msg) const {
  // Field 2: request_id
  if (_has_field_[2]) {
    msg->AppendVarInt(2, request_id_);
  }

  // Field 3: msg_bind_service
  if (_has_field_[3]) {
    (*msg_bind_service_).Serialize(msg->BeginNestedMessage<::protozero::Message>(3));
  }

  // Field 4: msg_bind_service_reply
  if (_has_field_[4]) {
    (*msg_bind_service_reply_).Serialize(msg->BeginNestedMessage<::protozero::Message>(4));
  }

  // Field 5: msg_invoke_method
  if (_has_field_[5]) {
    (*msg_invoke_method_).Serialize(msg->BeginNestedMessage<::protozero::Message>(5));
  }

  // Field 6: msg_invoke_method_reply
  if (_has_field_[6]) {
    (*msg_invoke_method_reply_).Serialize(msg->BeginNestedMessage<::protozero::Message>(6));
  }

  // Field 7: msg_request_error
  if (_has_field_[7]) {
    (*msg_request_error_).Serialize(msg->BeginNestedMessage<::protozero::Message>(7));
  }

  // Field 1: data_for_testing
  for (auto& it : data_for_testing_) {
    msg->AppendString(1, it);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}